

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

string * __thiscall
bandit::detail::option_map::comma_separated_list_abi_cxx11_
          (string *__return_storage_ptr__,option_map *this)

{
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
  __first;
  bool bVar1;
  pointer ppVar2;
  _Self *p_Var3;
  const_iterator __last;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  option_map *this_local;
  string *csl;
  
  it._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
       ::begin(&this->map);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
       ::end(&this->map);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)ppVar2);
    p_Var3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
             ::operator++(&local_28);
    __first._M_node = p_Var3->_M_node;
    __last = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
             ::end(&this->map);
    std::
    for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>,bandit::detail::option_map::comma_separated_list()const::_lambda(std::pair<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>>const&)_1_>
              (__first,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
                        )__last._M_node,(anon_class_8_1_ba1d3d5c)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[no registered entities]");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string comma_separated_list() const {
        std::string csl;
        auto it = map.begin();
        if (it != map.end()) {
          csl += it->first;
          std::for_each(++it, map.end(), [&](const std::pair<std::string, controller_func_t>& val) {
            csl += ", " + val.first;
          });
        } else {
          csl = "[no registered entities]";
        }
        return csl;
      }